

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_utils.h
# Opt level: O0

int draco::MostSignificantBit(uint32_t n)

{
  int iVar1;
  uint32_t n_local;
  
  iVar1 = 0x1f;
  if (n != 0) {
    for (; n >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  return iVar1;
}

Assistant:

inline int MostSignificantBit(uint32_t n) {
#if defined(__GNUC__)
  return 31 ^ __builtin_clz(n);
#elif defined(_MSC_VER)

  unsigned long where;
  _BitScanReverse(&where, n);
  return (int)where;
#else
  // TODO(fgalligan): Optimize this code.
  int msb = -1;
  while (n != 0) {
    msb++;
    n >>= 1;
  }
  return msb;
#endif
}